

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImGuiOldColumns>::clear_destruct(ImVector<ImGuiOldColumns> *this)

{
  long lVar1;
  int n;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < this->Size; lVar2 = lVar2 + 1) {
    ImGuiOldColumns::~ImGuiOldColumns((ImGuiOldColumns *)((long)&this->Data->ID + lVar1));
    lVar1 = lVar1 + 0x88;
  }
  clear(this);
  return;
}

Assistant:

inline void         clear_delete()                      { for (int n = 0; n < Size; n++) IM_DELETE(Data[n]); clear(); }